

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dish.cpp
# Opt level: O0

void __thiscall
zmq::dish_t::xattach_pipe(dish_t *this,pipe_t *pipe_,bool subscribe_to_all_,bool locally_initiated_)

{
  byte bVar1;
  byte in_CL;
  byte bVar2;
  byte in_DL;
  fq_t *in_RSI;
  pipe_t *in_stack_00000048;
  dish_t *in_stack_00000050;
  undefined6 in_stack_ffffffffffffffe8;
  
  bVar2 = in_DL & 1;
  bVar1 = in_CL & 1;
  if (in_RSI == (fq_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","pipe_",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dish.cpp"
            ,0x40);
    fflush(_stderr);
    zmq_abort((char *)0x2edcb1);
  }
  fq_t::attach(in_RSI,(pipe_t *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffe8)));
  dist_t::attach((dist_t *)in_RSI,
                 (pipe_t *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffe8)));
  send_subscriptions(in_stack_00000050,in_stack_00000048);
  return;
}

Assistant:

void zmq::dish_t::xattach_pipe (pipe_t *pipe_,
                                bool subscribe_to_all_,
                                bool locally_initiated_)
{
    LIBZMQ_UNUSED (subscribe_to_all_);
    LIBZMQ_UNUSED (locally_initiated_);

    zmq_assert (pipe_);
    _fq.attach (pipe_);
    _dist.attach (pipe_);

    //  Send all the cached subscriptions to the new upstream peer.
    send_subscriptions (pipe_);
}